

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint8_t __thiscall Cache::getByte(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  uint32_t *in_RDX;
  Cache *in_RDI;
  uint32_t offset_1;
  uint32_t offset;
  int blockId;
  uint32_t *in_stack_000000b0;
  uint32_t in_stack_000000bc;
  Cache *in_stack_000000c0;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t uVar5;
  uint32_t in_stack_ffffffffffffffc4;
  uint8_t local_1;
  
  in_RDI->referenceCounter = in_RDI->referenceCounter + 1;
  (in_RDI->statistics).numRead = (in_RDI->statistics).numRead + 1;
  uVar1 = getBlockId(in_RDI,in_stack_ffffffffffffffc4);
  if (uVar1 == 0xffffffff) {
    (in_RDI->statistics).numMiss = (in_RDI->statistics).numMiss + 1;
    (in_RDI->statistics).totalCycles =
         (ulong)(in_RDI->policy).missLatency + (in_RDI->statistics).totalCycles;
    loadBlockFromLowerLevel(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
    uVar1 = getBlockId(in_RDI,in_stack_ffffffffffffffc4);
    if (uVar1 == 0xffffffff) {
      fprintf(_stderr,"Error: data not in top level cache!\n");
      exit(-1);
    }
    uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
    uVar5 = in_RDI->referenceCounter;
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar3->lastReference = uVar5;
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    local_1 = *pvVar4;
  }
  else {
    uVar2 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
    (in_RDI->statistics).numHit = (in_RDI->statistics).numHit + 1;
    (in_RDI->statistics).totalCycles =
         (ulong)(in_RDI->policy).hitLatency + (in_RDI->statistics).totalCycles;
    uVar5 = in_RDI->referenceCounter;
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar3->lastReference = uVar5;
    if (in_RDX != (uint32_t *)0x0) {
      *in_RDX = (in_RDI->policy).hitLatency;
    }
    pvVar3 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       (&in_RDI->blocks,(long)(int)uVar1);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar3->data,(ulong)uVar2);
    local_1 = *pvVar4;
  }
  return local_1;
}

Assistant:

uint8_t Cache::getByte(uint32_t addr, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numRead++;

  // If in cache, return directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].lastReference = this->referenceCounter;
    if (cycles) *cycles = this->policy.hitLatency;
    return this->blocks[blockId].data[offset];
  }

  // Else, find the data in memory or other level of cache
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;
  this->loadBlockFromLowerLevel(addr, cycles);

  // The block is in top level cache now, return directly
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->blocks[blockId].lastReference = this->referenceCounter;
    return this->blocks[blockId].data[offset];
  } else {
    fprintf(stderr, "Error: data not in top level cache!\n");
    exit(-1);
  }
}